

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_3.h
# Opt level: O2

void __thiscall
PlayerMike_3::fillPredict(PlayerMike_3 *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  int *piVar1;
  pointer piVar2;
  pointer pMVar3;
  pointer pMVar4;
  int ix;
  long lVar5;
  ulong uVar6;
  
  piVar2 = (this->m_predict).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar5 = 0; lVar5 != 0x1b; lVar5 = lVar5 + 1) {
    piVar2[lVar5] = 0;
  }
  pMVar3 = (moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar4 = (moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->m_predict).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 1; uVar6 < (ulong)((long)pMVar4 - (long)pMVar3 >> 3); uVar6 = uVar6 + 1) {
    piVar1 = piVar2 + (long)pMVar3[uVar6].m_you +
                      (long)pMVar3[uVar6 - 1].m_me * 3 + (long)pMVar3[uVar6 - 1].m_you * 9;
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

void fillPredict(const std::vector<Move>& moveHistory)
   {
      for (int ix=0; ix<27; ++ix)
      {
         m_predict[ix] = 0;
      }

      for (size_t i=1; i<moveHistory.size(); ++i)
      {
         int ix = moveHistory[i-1].m_you*9 + moveHistory[i-1].m_me*3 + moveHistory[i].m_you;
         m_predict[ix] += 1;
      }

#ifdef DEBUG
      for (int row=0; row<9; ++row)
      {
         std::cout << m_predict[3*row] << " , " << m_predict[3*row+1] << " , " << m_predict[3*row+2] << std::endl;
      }
#endif
   }